

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::StoreData<std::__cxx11::string>
          (RequestBuilder *this,
          InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dh)

{
  pointer pOVar1;
  InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  CURLoption local_20 [2];
  InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dh_local;
  RequestBuilder *this_local;
  
  local_18 = dh;
  dh_local = (InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this;
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x5b3,
                  "RequestBuilder &restincurl::RequestBuilder::StoreData(InDataHandler<T> &) [T = std::basic_string<char>]"
                 );
  }
  pOVar1 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_20[1] = 0x4e2b;
  Options::Set<unsigned_long(char*,unsigned_long,unsigned_long,void*)>
            (pOVar1,local_20 + 1,
             InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::write_callback);
  pOVar1 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_20[0] = CURLOPT_WRITEDATA;
  local_28 = local_18;
  Options::Set<restincurl::InDataHandler<std::__cxx11::string>*>(pOVar1,local_20,&local_28);
  this->have_data_in_ = true;
  return this;
}

Assistant:

RequestBuilder& StoreData(InDataHandler<T>& dh) {
            assert(!is_built_);
            options_->Set(CURLOPT_WRITEFUNCTION, dh.write_callback);
            options_->Set(CURLOPT_WRITEDATA, &dh);
            have_data_in_ = true;
            return *this;
        }